

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# drbg.c
# Opt level: O2

void hmac_drbg_update(cf_hmac_drbg *ctx,void *in1,size_t nin1,void *in2,size_t nin2,void *in3,
                     size_t nin3)

{
  cf_hmac_ctx *pcVar1;
  cf_chash *hash;
  size_t sVar2;
  uint8_t zero;
  uint8_t one;
  size_t local_378;
  size_t local_370;
  void *local_368;
  cf_hmac_ctx *local_360;
  void *local_358;
  void *local_350;
  uint8_t new_key [64];
  cf_hmac_ctx local;
  
  pcVar1 = &ctx->hmac;
  hash = (ctx->hmac).hash;
  zero = '\0';
  local_378 = nin1;
  local_370 = nin2;
  local_368 = in3;
  memcpy(&local,pcVar1,0x2d8);
  cf_hmac_update(&local,ctx,hash->hashsz);
  cf_hmac_update(&local,&zero,1);
  local_358 = in1;
  cf_hmac_update(&local,in1,local_378);
  sVar2 = local_370;
  local_350 = in2;
  cf_hmac_update(&local,in2,local_370);
  cf_hmac_update(&local,local_368,nin3);
  cf_hmac_finish(&local,new_key);
  cf_hmac_init(pcVar1,hash,new_key,hash->hashsz);
  new_key[0] = '\0';
  new_key[1] = '\0';
  new_key[2] = '\0';
  new_key[3] = '\0';
  new_key[4] = '\0';
  new_key[5] = '\0';
  new_key[6] = '\0';
  new_key[7] = '\0';
  new_key[8] = '\0';
  new_key[9] = '\0';
  new_key[10] = '\0';
  new_key[0xb] = '\0';
  new_key[0xc] = '\0';
  new_key[0xd] = '\0';
  new_key[0xe] = '\0';
  new_key[0xf] = '\0';
  new_key[0x30] = '\0';
  new_key[0x31] = '\0';
  new_key[0x32] = '\0';
  new_key[0x33] = '\0';
  new_key[0x34] = '\0';
  new_key[0x35] = '\0';
  new_key[0x36] = '\0';
  new_key[0x37] = '\0';
  new_key[0x38] = '\0';
  new_key[0x39] = '\0';
  new_key[0x3a] = '\0';
  new_key[0x3b] = '\0';
  new_key[0x3c] = '\0';
  new_key[0x3d] = '\0';
  new_key[0x3e] = '\0';
  new_key[0x3f] = '\0';
  new_key[0x20] = '\0';
  new_key[0x21] = '\0';
  new_key[0x22] = '\0';
  new_key[0x23] = '\0';
  new_key[0x24] = '\0';
  new_key[0x25] = '\0';
  new_key[0x26] = '\0';
  new_key[0x27] = '\0';
  new_key[0x28] = '\0';
  new_key[0x29] = '\0';
  new_key[0x2a] = '\0';
  new_key[0x2b] = '\0';
  new_key[0x2c] = '\0';
  new_key[0x2d] = '\0';
  new_key[0x2e] = '\0';
  new_key[0x2f] = '\0';
  new_key[0x10] = '\0';
  new_key[0x11] = '\0';
  new_key[0x12] = '\0';
  new_key[0x13] = '\0';
  new_key[0x14] = '\0';
  new_key[0x15] = '\0';
  new_key[0x16] = '\0';
  new_key[0x17] = '\0';
  new_key[0x18] = '\0';
  new_key[0x19] = '\0';
  new_key[0x1a] = '\0';
  new_key[0x1b] = '\0';
  new_key[0x1c] = '\0';
  new_key[0x1d] = '\0';
  new_key[0x1e] = '\0';
  new_key[0x1f] = '\0';
  local_360 = pcVar1;
  memcpy(&local,pcVar1,0x2d8);
  cf_hmac_update(&local,ctx,hash->hashsz);
  cf_hmac_finish(&local,ctx->V);
  pcVar1 = local_360;
  if ((sVar2 != 0 || local_378 != 0) || nin3 != 0) {
    one = '\x01';
    memcpy(&local,local_360,0x2d8);
    cf_hmac_update(&local,ctx,hash->hashsz);
    cf_hmac_update(&local,&one,1);
    cf_hmac_update(&local,local_358,local_378);
    cf_hmac_update(&local,local_350,local_370);
    cf_hmac_update(&local,local_368,nin3);
    cf_hmac_finish(&local,new_key);
    cf_hmac_init(pcVar1,hash,new_key,hash->hashsz);
    new_key[0] = '\0';
    new_key[1] = '\0';
    new_key[2] = '\0';
    new_key[3] = '\0';
    new_key[4] = '\0';
    new_key[5] = '\0';
    new_key[6] = '\0';
    new_key[7] = '\0';
    new_key[8] = '\0';
    new_key[9] = '\0';
    new_key[10] = '\0';
    new_key[0xb] = '\0';
    new_key[0xc] = '\0';
    new_key[0xd] = '\0';
    new_key[0xe] = '\0';
    new_key[0xf] = '\0';
    new_key[0x30] = '\0';
    new_key[0x31] = '\0';
    new_key[0x32] = '\0';
    new_key[0x33] = '\0';
    new_key[0x34] = '\0';
    new_key[0x35] = '\0';
    new_key[0x36] = '\0';
    new_key[0x37] = '\0';
    new_key[0x38] = '\0';
    new_key[0x39] = '\0';
    new_key[0x3a] = '\0';
    new_key[0x3b] = '\0';
    new_key[0x3c] = '\0';
    new_key[0x3d] = '\0';
    new_key[0x3e] = '\0';
    new_key[0x3f] = '\0';
    new_key[0x20] = '\0';
    new_key[0x21] = '\0';
    new_key[0x22] = '\0';
    new_key[0x23] = '\0';
    new_key[0x24] = '\0';
    new_key[0x25] = '\0';
    new_key[0x26] = '\0';
    new_key[0x27] = '\0';
    new_key[0x28] = '\0';
    new_key[0x29] = '\0';
    new_key[0x2a] = '\0';
    new_key[0x2b] = '\0';
    new_key[0x2c] = '\0';
    new_key[0x2d] = '\0';
    new_key[0x2e] = '\0';
    new_key[0x2f] = '\0';
    new_key[0x10] = '\0';
    new_key[0x11] = '\0';
    new_key[0x12] = '\0';
    new_key[0x13] = '\0';
    new_key[0x14] = '\0';
    new_key[0x15] = '\0';
    new_key[0x16] = '\0';
    new_key[0x17] = '\0';
    new_key[0x18] = '\0';
    new_key[0x19] = '\0';
    new_key[0x1a] = '\0';
    new_key[0x1b] = '\0';
    new_key[0x1c] = '\0';
    new_key[0x1d] = '\0';
    new_key[0x1e] = '\0';
    new_key[0x1f] = '\0';
    memcpy(&local,pcVar1,0x2d8);
    cf_hmac_update(&local,ctx,hash->hashsz);
    cf_hmac_finish(&local,ctx->V);
  }
  return;
}

Assistant:

static void hmac_drbg_update(cf_hmac_drbg *ctx,
                             const void *in1, size_t nin1,
                             const void *in2, size_t nin2,
                             const void *in3, size_t nin3)
{
  cf_hmac_ctx local;
  const cf_chash *H = ctx->hmac.hash;
  uint8_t new_key[CF_MAXHASH];
  uint8_t zero = 0;

  /* 1. K = HMAC(K, V || 0x00 || provided_data) */
  local = ctx->hmac;
  cf_hmac_update(&local, ctx->V, H->hashsz);
  cf_hmac_update(&local, &zero, sizeof zero);
  cf_hmac_update(&local, in1, nin1);
  cf_hmac_update(&local, in2, nin2);
  cf_hmac_update(&local, in3, nin3);
  cf_hmac_finish(&local, new_key);
  cf_hmac_init(&ctx->hmac, H, new_key, H->hashsz);
  mem_clean(new_key, sizeof new_key);

  /* 2. V = HMAC(K, V) */
  local = ctx->hmac;
  cf_hmac_update(&local, ctx->V, H->hashsz);
  cf_hmac_finish(&local, ctx->V);

  /* 3. if (provided_data = null) then return K and V */
  if (nin1 == 0 && nin2 == 0 && nin3 == 0)
    return;

  /* 4. K = HMAC(K, V || 0x01 || provided_data) */
  uint8_t one = 1;
  local = ctx->hmac;
  cf_hmac_update(&local, ctx->V, H->hashsz);
  cf_hmac_update(&local, &one, sizeof one);
  cf_hmac_update(&local, in1, nin1);
  cf_hmac_update(&local, in2, nin2);
  cf_hmac_update(&local, in3, nin3);
  cf_hmac_finish(&local, new_key);
  cf_hmac_init(&ctx->hmac, H, new_key, H->hashsz);
  mem_clean(new_key, sizeof new_key);

  /* 5. V = HMAC(K, V) */
  local = ctx->hmac;
  cf_hmac_update(&local, ctx->V, H->hashsz);
  cf_hmac_finish(&local, ctx->V);
}